

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectgenerator.cpp
# Opt level: O2

bool __thiscall ProjectGenerator::addFile(ProjectGenerator *this,QString file)

{
  Data *pDVar1;
  char16_t *pcVar2;
  bool bVar3;
  char cVar4;
  qsizetype qVar5;
  pointer pQVar6;
  QList<ProString> *this_00;
  int iVar7;
  QString *in_RSI;
  char *str;
  ProjectGenerator *this_01;
  ulong uVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_d8;
  ProString local_b8;
  ProKey where;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  MakefileGenerator::fileFixify
            ((QString *)&where,&this->super_MakefileGenerator,in_RSI,(FileFixifyTypes)0x2,true);
  pDVar1 = (in_RSI->d).d;
  pcVar2 = (in_RSI->d).ptr;
  (in_RSI->d).d = where.super_ProString.m_string.d.d;
  (in_RSI->d).ptr = where.super_ProString.m_string.d.ptr;
  qVar5 = (in_RSI->d).size;
  (in_RSI->d).size = where.super_ProString.m_string.d.size;
  where.super_ProString.m_string.d.d = pDVar1;
  where.super_ProString.m_string.d.ptr = pcVar2;
  where.super_ProString.m_string.d.size = qVar5;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&where);
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  qVar5 = QString::lastIndexOf(in_RSI,&Option::dir_sep,CaseSensitive);
  if ((int)qVar5 != -1) {
    QString::left((QString *)&where,in_RSI,(long)((int)qVar5 + 1));
    local_58.ptr = where.super_ProString.m_string.d.ptr;
    local_58.d = where.super_ProString.m_string.d.d;
    where.super_ProString.m_string.d.d = (Data *)0x0;
    where.super_ProString.m_string.d.ptr = (char16_t *)0x0;
    local_58.size = where.super_ProString.m_string.d.size;
    where.super_ProString.m_string.d.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&where);
  }
  QString::mid((longlong)&where,(longlong)in_RSI);
  bVar3 = comparesEqual((QString *)&where,&Option::h_moc_mod);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&where);
  if (bVar3) {
    bVar3 = false;
    goto LAB_00173377;
  }
  where.super_ProString.m_file = -0x55555556;
  where.super_ProString._36_4_ = 0xaaaaaaaa;
  where.super_ProString.m_hash = 0xaaaaaaaaaaaaaaaa;
  where.super_ProString.m_string.d.size = -0x5555555555555556;
  where.super_ProString.m_offset = -0x55555556;
  where.super_ProString.m_length = -0x55555556;
  where.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  where.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  ProString::ProString(&where.super_ProString);
  uVar8 = 0xffffffffffffffff;
  iVar7 = 0;
  do {
    uVar8 = uVar8 + 1;
    if ((ulong)Option::cpp_ext.d.size <= uVar8) goto LAB_001730e3;
    pQVar6 = QList<QString>::data(&Option::cpp_ext);
    cVar4 = QString::endsWith((QString *)in_RSI,iVar7 + (int)pQVar6);
    iVar7 = iVar7 + 0x18;
  } while (cVar4 == '\0');
  ProKey::ProKey((ProKey *)&local_b8,"SOURCES");
  ProString::operator=(&where.super_ProString,&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
LAB_001730e3:
  if (where.super_ProString.m_length == 0) {
    uVar8 = 0xffffffffffffffff;
    iVar7 = 0;
    do {
      uVar8 = uVar8 + 1;
      if ((ulong)Option::h_ext.d.size <= uVar8) goto LAB_0017314b;
      cVar4 = QString::endsWith((QString *)in_RSI,iVar7 + (int)Option::h_ext.d.ptr);
      iVar7 = iVar7 + 0x18;
    } while (cVar4 == '\0');
    ProKey::ProKey((ProKey *)&local_b8,"HEADERS");
    ProString::operator=(&where.super_ProString,&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
LAB_0017314b:
    if (where.super_ProString.m_length == 0) {
      uVar8 = 0xffffffffffffffff;
      iVar7 = 0;
      do {
        uVar8 = uVar8 + 1;
        if ((ulong)Option::c_ext.d.size <= uVar8) goto LAB_001731bd;
        pQVar6 = QList<QString>::data(&Option::c_ext);
        cVar4 = QString::endsWith((QString *)in_RSI,iVar7 + (int)pQVar6);
        iVar7 = iVar7 + 0x18;
      } while (cVar4 == '\0');
      ProKey::ProKey((ProKey *)&local_b8,"SOURCES");
      ProString::operator=(&where.super_ProString,&local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
LAB_001731bd:
      if (where.super_ProString.m_length == 0) {
        cVar4 = QString::endsWith((QString *)in_RSI,0x26baa0);
        if (cVar4 == '\0') {
          cVar4 = QString::endsWith((QString *)in_RSI,0x26bb80);
          if (cVar4 == '\0') {
            cVar4 = QString::endsWith((QString *)in_RSI,0x26bba0);
            if (cVar4 == '\0') {
              QString::QString(&local_b8.m_string,".ts");
              cVar4 = QString::endsWith((QString *)in_RSI,(CaseSensitivity)&local_b8);
              if (cVar4 == '\0') {
                QString::QString((QString *)&local_d8,".xlf");
                cVar4 = QString::endsWith((QString *)in_RSI,(CaseSensitivity)&local_d8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_b8);
                if (cVar4 == '\0') {
                  QString::QString(&local_b8.m_string,".qrc");
                  cVar4 = QString::endsWith((QString *)in_RSI,(CaseSensitivity)&local_b8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_b8);
                  if (cVar4 == '\0') goto LAB_001732c5;
                  str = "RESOURCES";
                  goto LAB_001732a3;
                }
              }
              else {
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_b8);
              }
              str = "TRANSLATIONS";
            }
            else {
              str = "YACCSOURCES";
            }
          }
          else {
            str = "LEXSOURCES";
          }
        }
        else {
          str = "FORMS";
        }
LAB_001732a3:
        ProKey::ProKey((ProKey *)&local_b8,str);
        ProString::operator=(&where.super_ProString,&local_b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
      }
    }
  }
LAB_001732c5:
  local_d8.size = -0x5555555555555556;
  local_d8.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_d8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  this_01 = this;
  MakefileGenerator::fileFixify
            (&local_b8.m_string,&this->super_MakefileGenerator,in_RSI,(FileFixifyTypes)0x0,true);
  fixPathToQmake((QString *)&local_d8,this_01,&local_b8.m_string);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
  this_00 = &QMakeEvaluator::valuesRef
                       (&((this->super_MakefileGenerator).project)->super_QMakeEvaluator,&where)->
             super_QList<ProString>;
  bVar3 = ProStringList::contains((ProStringList *)this_00,(QString *)&local_d8,CaseInsensitive);
  if (!bVar3) {
    ProString::ProString(&local_b8,(QString *)&local_d8);
    QList<ProString>::emplaceBack<ProString>(this_00,&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
  }
  bVar3 = !bVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&where);
LAB_00173377:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool
ProjectGenerator::addFile(QString file)
{
    file = fileFixify(file, FileFixifyToIndir);
    QString dir;
    int s = file.lastIndexOf(Option::dir_sep);
    if(s != -1)
        dir = file.left(s+1);
    if(file.mid(dir.size(), Option::h_moc_mod.size()) == Option::h_moc_mod)
        return false;

    ProKey where;
    for(int cppit = 0; cppit < Option::cpp_ext.size(); ++cppit) {
        if(file.endsWith(Option::cpp_ext[cppit])) {
            where = "SOURCES";
            break;
        }
    }
    if(where.isEmpty()) {
        for(int hit = 0; hit < Option::h_ext.size(); ++hit)
            if(file.endsWith(Option::h_ext.at(hit))) {
                where = "HEADERS";
                break;
            }
    }
    if(where.isEmpty()) {
        for(int cit = 0; cit < Option::c_ext.size(); ++cit) {
            if(file.endsWith(Option::c_ext[cit])) {
                where = "SOURCES";
                break;
            }
        }
    }
    if(where.isEmpty()) {
        if(file.endsWith(Option::ui_ext))
            where = "FORMS";
        else if(file.endsWith(Option::lex_ext))
            where = "LEXSOURCES";
        else if(file.endsWith(Option::yacc_ext))
            where = "YACCSOURCES";
        else if(file.endsWith(".ts") || file.endsWith(".xlf"))
            where = "TRANSLATIONS";
        else if(file.endsWith(".qrc"))
            where = "RESOURCES";
    }

    QString newfile = fixPathToQmake(fileFixify(file));

    ProStringList &endList = project->values(where);
    if(!endList.contains(newfile, Qt::CaseInsensitive)) {
        endList += newfile;
        return true;
    }
    return false;
}